

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O3

void __thiscall
booster::aio::basic_io_device::set_non_blocking(basic_io_device *this,bool nonblocking)

{
  int iVar1;
  system_error *this_00;
  error_code eVar2;
  error_code e;
  error_code local_30;
  
  local_30._M_value = 0;
  local_30._M_cat = (error_category *)std::_V2::system_category();
  set_non_blocking(this,nonblocking,&local_30);
  iVar1 = local_30._M_value;
  if (local_30._M_value == 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar2._4_4_ = 0;
  eVar2._M_value = iVar1;
  eVar2._M_cat = local_30._M_cat;
  system::system_error::system_error(this_00,eVar2);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_io_device::set_non_blocking(bool nonblocking)
{
	system::error_code e;
	set_non_blocking(nonblocking,e);
	if(e) throw system::system_error(e);
}